

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O2

void __thiscall UdpBitDht::findDhtValue(UdpBitDht *this,bdNodeId *id,string *key,uint32_t mode)

{
  bdNodeManager *pbVar1;
  string asStack_48 [32];
  
  pthread_mutex_lock((pthread_mutex_t *)&this->dhtMtx);
  pbVar1 = this->mBitDhtManager;
  std::__cxx11::string::string(asStack_48,(string *)key);
  (*(pbVar1->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[10])
            (pbVar1,id,asStack_48,(ulong)mode);
  std::__cxx11::string::~string(asStack_48);
  pthread_mutex_unlock((pthread_mutex_t *)&this->dhtMtx);
  return;
}

Assistant:

void UdpBitDht::findDhtValue(bdNodeId *id, std::string key, uint32_t mode) {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	mBitDhtManager->findDhtValue(id, key, mode);
}